

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

int main(void)

{
  void *pvVar1;
  void *pvVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  undefined8 uVar7;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  SearchInfo info;
  Move move;
  string input;
  Board pos;
  allocator<char> local_1f59;
  string local_1f58;
  undefined2 local_1f38;
  Move local_1f30;
  string local_1f28;
  Board local_1f08;
  
  board::Board::INIT();
  search::movegen::INIT();
  board::Board::Board(&local_1f08);
  local_1f30.value = 0;
  local_1f30.score = 0;
  local_1f28._M_dataplus._M_p = (pointer)&local_1f28.field_2;
  local_1f28._M_string_length = 0;
  local_1f28.field_2._M_local_buf[0] = '\0';
LAB_00102638:
  do {
    paVar9 = &local_1f58.field_2;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    board::Board::print(&local_1f08);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    std::vector<board::Undo,_std::allocator<board::Undo>_>::vector
              ((vector<board::Undo,_std::allocator<board::Undo>_> *)&local_1f58,&local_1f08.history)
    ;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
    pvVar1 = (void *)CONCAT44(local_1f58._M_dataplus._M_p._4_4_,local_1f58._M_dataplus._M_p._0_4_);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,CONCAT44(local_1f58.field_2._M_allocated_capacity._4_4_,
                                      local_1f58.field_2._M_allocated_capacity._0_4_) - (long)pvVar1
                     );
    }
    cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x30);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_1f28,cVar3);
    iVar5 = std::__cxx11::string::compare((char *)&local_1f28);
    if (iVar5 == 0) {
      io::uci::loop();
LAB_00102aa8:
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
      std::ostream::put('8');
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f28._M_dataplus._M_p != &local_1f28.field_2) {
        operator_delete(local_1f28._M_dataplus._M_p,
                        CONCAT71(local_1f28.field_2._M_allocated_capacity._1_7_,
                                 local_1f28.field_2._M_local_buf[0]) + 1);
      }
      if (local_1f08.history.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f08.history.
                        super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1f08.history.
                              super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f08.history.
                              super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return 0;
    }
    iVar5 = std::__cxx11::string::compare((char *)&local_1f28);
    if (iVar5 == 0) goto LAB_00102aa8;
    iVar5 = std::__cxx11::string::compare((char *)&local_1f28);
    if (iVar5 != 0) {
      if (2 < local_1f28._M_string_length) {
        std::__cxx11::string::substr((ulong)&local_1f58,(ulong)&local_1f28);
        iVar5 = std::__cxx11::string::compare((char *)&local_1f58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_1f58._M_dataplus._M_p._4_4_,local_1f58._M_dataplus._M_p._0_4_) !=
            paVar9) {
          operator_delete((undefined1 *)
                          CONCAT44(local_1f58._M_dataplus._M_p._4_4_,
                                   local_1f58._M_dataplus._M_p._0_4_),
                          CONCAT44(local_1f58.field_2._M_allocated_capacity._4_4_,
                                   local_1f58.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if (iVar5 == 0) {
          std::__cxx11::string::substr((ulong)&local_1f58,(ulong)&local_1f28);
          bVar4 = board::Board::parseFen(&local_1f08,&local_1f58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_1f58._M_dataplus._M_p._4_4_,local_1f58._M_dataplus._M_p._0_4_) !=
              paVar9) {
            operator_delete((undefined1 *)
                            CONCAT44(local_1f58._M_dataplus._M_p._4_4_,
                                     local_1f58._M_dataplus._M_p._0_4_),
                            CONCAT44(local_1f58.field_2._M_allocated_capacity._4_4_,
                                     local_1f58.field_2._M_allocated_capacity._0_4_) + 1);
          }
          if (!bVar4) {
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
            std::ostream::put('8');
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"ERROR Invalid FEN",0x11);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
            std::ostream::put('8');
            std::ostream::flush();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1f58,board::Board::DEFAULT_FEN,&local_1f59);
            board::Board::parseFen(&local_1f08,&local_1f58);
            goto LAB_00102845;
          }
          goto LAB_00102638;
        }
      }
      iVar5 = std::__cxx11::string::compare((char *)&local_1f28);
      if (iVar5 == 0) {
        std::vector<board::Undo,_std::allocator<board::Undo>_>::vector
                  ((vector<board::Undo,_std::allocator<board::Undo>_> *)&local_1f58,
                   &local_1f08.history);
        pvVar1 = (void *)CONCAT44(local_1f58._M_dataplus._M_p._4_4_,
                                  local_1f58._M_dataplus._M_p._0_4_);
        pvVar2 = (void *)CONCAT44(local_1f58._M_string_length._4_4_,
                                  (undefined4)local_1f58._M_string_length);
        if (pvVar1 != (void *)0x0) {
          operator_delete(pvVar1,CONCAT44(local_1f58.field_2._M_allocated_capacity._4_4_,
                                          local_1f58.field_2._M_allocated_capacity._0_4_) -
                                 (long)pvVar1);
        }
        if (pvVar1 != pvVar2) {
          board::makemove::undo(&local_1f08);
        }
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_1f28);
        if (iVar5 == 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
          std::ostream::put('8');
          std::ostream::flush();
          local_1f58._M_dataplus._M_p._0_4_ = 0xffffffff;
          local_1f58._M_string_length._0_4_ = 0xffffffff;
          local_1f58._M_string_length._4_4_ = 0xffffffff;
          local_1f58.field_2._M_allocated_capacity._0_4_ = 0xffffffff;
          local_1f58.field_2._M_allocated_capacity._4_4_ = 0xffffffff;
          local_1f58.field_2._8_8_ = 0xffffffffffffffff;
          local_1f38 = 0;
          search::go();
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)&local_1f28);
          if (iVar5 == 0) {
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
            std::ostream::put('8');
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Evaluation: ",0xc);
            iVar5 = board::evaluate::score(&local_1f08);
            plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
            std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
            std::ostream::put((char)plVar8);
            std::ostream::flush();
          }
          else {
            local_1f30 = io::parseMove(&local_1f28,&local_1f08);
            bVar4 = board::makemove::move(&local_1f30,&local_1f08);
            if (!bVar4) {
              uVar7 = __cxa_rethrow();
              __cxa_end_catch();
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f28._M_dataplus._M_p != &local_1f28.field_2) {
                operator_delete(local_1f28._M_dataplus._M_p,
                                CONCAT71(local_1f28.field_2._M_allocated_capacity._1_7_,
                                         local_1f28.field_2._M_local_buf[0]) + 1);
              }
              if (local_1f08.history.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1f08.history.
                                super__Vector_base<board::Undo,_std::allocator<board::Undo>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_1f08.history.
                                      super__Vector_base<board::Undo,_std::allocator<board::Undo>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_1f08.history.
                                      super__Vector_base<board::Undo,_std::allocator<board::Undo>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              _Unwind_Resume(uVar7);
            }
          }
        }
      }
      goto LAB_00102638;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f58,board::Board::DEFAULT_FEN,&local_1f59);
    board::Board::parseFen(&local_1f08,&local_1f58);
LAB_00102845:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1f58._M_dataplus._M_p._4_4_,local_1f58._M_dataplus._M_p._0_4_) != paVar9)
    {
      operator_delete((undefined1 *)
                      CONCAT44(local_1f58._M_dataplus._M_p._4_4_,local_1f58._M_dataplus._M_p._0_4_),
                      CONCAT44(local_1f58.field_2._M_allocated_capacity._4_4_,
                               local_1f58.field_2._M_allocated_capacity._0_4_) + 1);
    }
  } while( true );
}

Assistant:

int main()
{
    board::Board::INIT();
    search::movegen::INIT();
    board::Board pos;
    board::Move move;
    std::string input;
    while (true) {
        std::cout << std::endl;
        pos.print();
        std::cout << std::endl;
        std::cout << ((pos.getHistory().size() / 2) + 1) << ": ";
        std::getline(std::cin, input);
        if (input == "uci") {
            io::uci::loop();
            break;
        }
        if (input == "q") {
            break;
        }
        if (input == "n") {
            pos.parseFen(board::Board::DEFAULT_FEN);
        }
        else if (input.length() > 2 && input.substr(0, 2) == "n ") {
            if (!pos.parseFen(input.substr(2))) {
                std::cout << std::endl;
                std::cout << "ERROR Invalid FEN" << std::endl;
                pos.parseFen(board::Board::DEFAULT_FEN);
            }
        }
        else if (input == "u") {
            if (!pos.getHistory().empty()) {
                board::makemove::undo(pos);
            }
        }
        else if (input == "s") {
            std::cout << std::endl;
            search::SearchInfo info(-1);
            search::go(pos, info);
        }
        else if (input == "e") {
            std::cout << std::endl;
            std::cout << "Evaluation: " << board::evaluate::score(pos) << std::endl;
        }
        else {
            try {
                move = io::parseMove(input, pos);
                if (!board::makemove::move(move, pos)) {
                    throw;
                }
            }
            catch (int) {
                std::cout << std::endl;
                std::cout << "ERROR Invalid input" << std::endl;
            }
        }
    }
    std::cout << std::endl;
    return 0;
}